

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.h
# Opt level: O0

void __thiscall Polynom<Finite>::Polynom(Polynom<Finite> *this,Matrix<Finite> *matr)

{
  uint uVar1;
  char *pcVar2;
  Matrix<Finite> *in_RSI;
  matrix_error *in_RDI;
  Polynom<Finite> *in_stack_00000010;
  Matrix<Finite> *in_stack_ffffffffffffffe8;
  
  Matrix<Finite>::Matrix(in_RSI,in_stack_ffffffffffffffe8);
  uVar1 = Matrix<Finite>::height(in_RSI);
  if (uVar1 != 1) {
    pcVar2 = (char *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(in_RDI,pcVar2);
    __cxa_throw(pcVar2,&matrix_error::typeinfo,matrix_error::~matrix_error);
  }
  strip(in_stack_00000010);
  return;
}

Assistant:

explicit Polynom(const Matrix<Field> &matr): m(matr)
    {
        if(matr.height() != 1)
            throw matrix_error("Polynom: matrix 1*n required");
        strip();
    }